

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

int sam_parse1(kstring_t *s,bam_hdr_t *h,bam1_t *b)

{
  char cVar1;
  int iVar2;
  uint32_t uVar3;
  uint uVar4;
  void *pvVar5;
  ulong uVar6;
  long lVar7;
  ushort **ppuVar8;
  char *pcVar9;
  char *pcVar10;
  byte *pbVar11;
  bool bVar12;
  double dVar13;
  uint local_dc;
  float local_d4;
  undefined4 local_d0;
  float x_10;
  uint32_t x_9;
  int32_t x_8;
  uint16_t x_7;
  int16_t x_6;
  uint8_t x_5;
  char *pcStack_c0;
  int8_t x_4;
  char *r;
  double dStack_b0;
  int32_t n;
  double x_3;
  undefined4 local_a0;
  float x_2;
  uint32_t y_3;
  uint16_t y_2;
  unsigned_long x_1;
  int32_t y_1;
  int16_t y;
  long x;
  uint8_t type;
  ulong uStack_78;
  int op;
  size_t n_cigar;
  uint32_t *cigar;
  bam1_core_t *c;
  kstring_t str;
  byte *pbStack_40;
  int i;
  char *q;
  char *p;
  uint8_t *t;
  bam1_t *b_local;
  bam_hdr_t *h_local;
  kstring_t *s_local;
  
  q = s->s;
  b->l_data = 0;
  c = (bam1_core_t *)0x0;
  str.m = (size_t)b->data;
  str.l = (size_t)b->m_data;
  cigar = (uint32_t *)b;
  t = (uint8_t *)b;
  b_local = (bam1_t *)h;
  h_local = (bam_hdr_t *)s;
  memset(b,0,0x20);
  lVar7._0_4_ = (b_local->core).mpos;
  lVar7._4_4_ = (b_local->core).isize;
  if (lVar7 == 0) {
    pvVar5 = malloc(0x80);
    *(void **)&(b_local->core).mpos = pvVar5;
    for (str.s._4_4_ = 0; (int)str.s._4_4_ < 0x80; str.s._4_4_ = str.s._4_4_ + 1) {
      *(undefined1 *)(*(long *)&(b_local->core).mpos + (long)(int)str.s._4_4_) = 0xff;
    }
    for (str.s._4_4_ = 0; "MIDNSHP=XB"[(int)str.s._4_4_] != '\0'; str.s._4_4_ = str.s._4_4_ + 1) {
      *(char *)(*(long *)&(b_local->core).mpos + (long)(int)"MIDNSHP=XB"[(int)str.s._4_4_]) =
           (char)str.s._4_4_;
    }
  }
  pcVar10 = q;
  pbStack_40 = (byte *)q;
  while( true ) {
    bVar12 = false;
    if (*q != '\0') {
      bVar12 = *q != '\t';
    }
    if (!bVar12) break;
    q = q + 1;
  }
  if (*q == '\t') {
    pcVar9 = q + 1;
    *q = '\0';
    q = pcVar9;
    kputsn_(pcVar10,(int)pcVar9 - (int)pcVar10,(kstring_t *)&c);
    *(ulong *)(cigar + 2) =
         *(ulong *)(cigar + 2) & 0xffffffff00ffffff |
         ((ulong)(uint)((int)q - (int)pbStack_40) & 0xff) << 0x18;
    uVar6 = strtol(q,&q,0);
    *(ulong *)(cigar + 2) = *(ulong *)(cigar + 2) & 0xffff0000ffffffff | (uVar6 & 0xffff) << 0x20;
    pbStack_40 = (byte *)(q + 1);
    cVar1 = *q;
    q = (char *)pbStack_40;
    if (cVar1 == '\t') {
      while( true ) {
        bVar12 = false;
        if (*q != '\0') {
          bVar12 = *q != '\t';
        }
        if (!bVar12) break;
        q = q + 1;
      }
      if (*q == '\t') {
        *q = '\0';
        q = q + 1;
        iVar2 = strcmp((char *)pbStack_40,"*");
        if (iVar2 == 0) {
          *cigar = 0xffffffff;
        }
        else {
          if (((b_local->core).tid == 0) && (0 < hts_verbose)) {
            fprintf(_stderr,"[E::%s] missing SAM header\n","sam_parse1");
            goto LAB_0011a0a6;
          }
          uVar3 = bam_name2id((bam_hdr_t *)b_local,(char *)pbStack_40);
          *cigar = uVar3;
          if (((int)*cigar < 0) && (1 < hts_verbose)) {
            fprintf(_stderr,"[W::%s] urecognized reference name; treated as unmapped\n","sam_parse1"
                   );
          }
        }
        lVar7 = strtol(q,&q,10);
        cigar[1] = (int)lVar7 - 1;
        pcVar10 = q + 1;
        if (*q == '\t') {
          q = pcVar10;
          if (((int)cigar[1] < 0) && (-1 < (int)*cigar)) {
            if (1 < hts_verbose) {
              fprintf(_stderr,
                      "[W::%s] mapped query cannot have zero coordinate; treated as unmapped\n",
                      "sam_parse1");
            }
            *cigar = 0xffffffff;
          }
          if ((int)*cigar < 0) {
            *(ulong *)(cigar + 2) =
                 *(ulong *)(cigar + 2) & 0xffff0000ffffffff |
                 (ulong)((uint)((ulong)*(undefined8 *)(cigar + 2) >> 0x20) & 0xffff | 4) << 0x20;
          }
          uVar6 = strtol(q,&q,10);
          *(ulong *)(cigar + 2) =
               *(ulong *)(cigar + 2) & 0xffffffffff00ffff | (uVar6 & 0xff) << 0x10;
          pbVar11 = (byte *)(q + 1);
          if (*q == '\t') {
            q = (char *)pbVar11;
            if (*pbVar11 == 0x2a) {
              if (((*(ulong *)(cigar + 2) & 0x400000000) == 0) && (1 < hts_verbose)) {
                fprintf(_stderr,"[W::%s] mapped query must have a CIGAR; treated as unmapped\n",
                        "sam_parse1");
              }
              *(ulong *)(cigar + 2) =
                   *(ulong *)(cigar + 2) & 0xffff0000ffffffff |
                   (ulong)((uint)((ulong)*(undefined8 *)(cigar + 2) >> 0x20) & 0xffff | 4) << 0x20;
              pbStack_40 = (byte *)q;
              while( true ) {
                bVar12 = false;
                if (*q != '\0') {
                  bVar12 = *q != '\t';
                }
                if (!bVar12) break;
                q = q + 1;
              }
              if (*q != '\t') goto LAB_0011a0a6;
              *q = '\0';
              str.s._4_4_ = 1;
              q = q + 1;
            }
            else {
              uStack_78 = 0;
              pbStack_40 = pbVar11;
              while( true ) {
                bVar12 = false;
                if (*q != '\0') {
                  bVar12 = *q != '\t';
                }
                if (!bVar12) break;
                ppuVar8 = __ctype_b_loc();
                if (((*ppuVar8)[(int)*q] & 0x800) == 0) {
                  uStack_78 = uStack_78 + 1;
                }
                q = q + 1;
              }
              if (*q != '\t') goto LAB_0011a0a6;
              if ((0xffff < uStack_78) && (0 < hts_verbose)) {
                q = q + 1;
                fprintf(_stderr,"[E::%s] too many CIGAR operations\n","sam_parse1");
                goto LAB_0011a0a6;
              }
              *(ulong *)(cigar + 2) = *(ulong *)(cigar + 2) & 0xffffffffffff | uStack_78 << 0x30;
              q = q + 1;
              ks_resize((kstring_t *)&c,
                        (long)&c->tid +
                        (long)(int)((uint)(ushort)((ulong)*(undefined8 *)(cigar + 2) >> 0x30) << 2))
              ;
              n_cigar = (long)&c->tid + str.m;
              c = (bam1_core_t *)
                  ((long)&c->tid +
                  (long)(int)((uint)(ushort)((ulong)*(undefined8 *)(cigar + 2) >> 0x30) << 2));
              for (str.s._4_4_ = 0;
                  (int)str.s._4_4_ < (int)(uint)(ushort)((ulong)*(undefined8 *)(cigar + 2) >> 0x30);
                  str.s._4_4_ = str.s._4_4_ + 1) {
                lVar7 = strtol((char *)pbStack_40,(char **)&stack0xffffffffffffffc0,10);
                *(int *)(n_cigar + (long)(int)str.s._4_4_ * 4) = (int)(lVar7 << 4);
                if (*pbStack_40 < 0x80) {
                  local_dc = (uint)*(char *)(*(long *)&(b_local->core).mpos +
                                            (long)(int)(char)*pbStack_40);
                }
                else {
                  local_dc = 0xffffffff;
                }
                x._4_4_ = local_dc;
                if (((int)local_dc < 0) && (0 < hts_verbose)) {
                  fprintf(_stderr,"[E::%s] unrecognized CIGAR operator\n","sam_parse1");
                  goto LAB_0011a0a6;
                }
                *(uint *)(n_cigar + (long)(int)str.s._4_4_ * 4) =
                     local_dc | *(uint *)(n_cigar + (long)(int)str.s._4_4_ * 4);
                pbStack_40 = pbStack_40 + 1;
              }
              str.s._4_4_ = bam_cigar2rlen((uint)(ushort)((ulong)*(undefined8 *)(cigar + 2) >> 0x30)
                                           ,(uint32_t *)n_cigar);
            }
            uVar4 = hts_reg2bin((long)(int)cigar[1],(long)(int)(cigar[1] + str.s._4_4_),0xe,5);
            pcVar10 = q;
            *(ulong *)(cigar + 2) =
                 *(ulong *)(cigar + 2) & 0xffffffffffff0000 | (ulong)uVar4 & 0xffff;
            pbStack_40 = (byte *)q;
            while( true ) {
              bVar12 = false;
              if (*q != '\0') {
                bVar12 = *q != '\t';
              }
              if (!bVar12) break;
              q = q + 1;
            }
            if (*q == '\t') {
              *q = '\0';
              q = q + 1;
              iVar2 = strcmp(pcVar10,"=");
              if (iVar2 == 0) {
                cigar[5] = *cigar;
              }
              else {
                iVar2 = strcmp((char *)pbStack_40,"*");
                if (iVar2 == 0) {
                  cigar[5] = 0xffffffff;
                }
                else {
                  uVar3 = bam_name2id((bam_hdr_t *)b_local,(char *)pbStack_40);
                  cigar[5] = uVar3;
                }
              }
              lVar7 = strtol(q,&q,10);
              cigar[6] = (int)lVar7 - 1;
              pcVar10 = q + 1;
              if (*q == '\t') {
                q = pcVar10;
                if (((int)cigar[6] < 0) && (-1 < (int)cigar[5])) {
                  if (1 < hts_verbose) {
                    fprintf(_stderr,
                            "[W::%s] mapped mate cannot have zero coordinate; treated as unmapped\n"
                            ,"sam_parse1");
                  }
                  cigar[5] = 0xffffffff;
                }
                lVar7 = strtol(q,&q,10);
                cigar[7] = (uint32_t)lVar7;
                pbStack_40 = (byte *)(q + 1);
                cVar1 = *q;
                q = (char *)pbStack_40;
                if (cVar1 == '\t') {
                  while( true ) {
                    bVar12 = false;
                    if (*q != '\0') {
                      bVar12 = *q != '\t';
                    }
                    if (!bVar12) break;
                    q = q + 1;
                  }
                  if (*q == '\t') {
                    *q = '\0';
                    q = q + 1;
                    iVar2 = strcmp((char *)pbStack_40,"*");
                    if (iVar2 == 0) {
                      cigar[4] = 0;
                    }
                    else {
                      cigar[4] = ((int)q - (int)pbStack_40) - 1;
                      str.s._4_4_ = bam_cigar2qlen((uint)(ushort)((ulong)*(undefined8 *)(cigar + 2)
                                                                 >> 0x30),
                                                   (uint32_t *)
                                                   (str.m + (long)(int)((uint)((ulong)*(undefined8 *
                                                                                       )(cigar + 2)
                                                                              >> 0x18) & 0xff)));
                      if ((((short)((ulong)*(undefined8 *)(cigar + 2) >> 0x30) != 0) &&
                          (str.s._4_4_ != cigar[4])) && (0 < hts_verbose)) {
                        fprintf(_stderr,"[E::%s] CIGAR and query sequence are of different length\n"
                                ,"sam_parse1");
                        goto LAB_0011a0a6;
                      }
                      str.s._4_4_ = (int)(cigar[4] + 1) >> 1;
                      ks_resize((kstring_t *)&c,(long)&c->tid + (long)(int)str.s._4_4_);
                      p = (char *)((long)&c->tid + str.m);
                      c = (bam1_core_t *)((long)&c->tid + (long)(int)str.s._4_4_);
                      memset(p,0,(long)(int)str.s._4_4_);
                      for (str.s._4_4_ = 0; (int)str.s._4_4_ < (int)cigar[4];
                          str.s._4_4_ = str.s._4_4_ + 1) {
                        p[(int)str.s._4_4_ >> 1] =
                             p[(int)str.s._4_4_ >> 1] |
                             "\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x01\x02\x04\b\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f"
                             [(int)((char *)pbStack_40)[(int)str.s._4_4_]] <<
                             (sbyte)(((str.s._4_4_ ^ 0xffffffff) & 1) << 2);
                      }
                    }
                    pbStack_40 = (byte *)q;
                    while( true ) {
                      bVar12 = false;
                      if (*q != '\0') {
                        bVar12 = *q != '\t';
                      }
                      if (!bVar12) break;
                      q = q + 1;
                    }
                    *q = '\0';
                    q = q + 1;
                    ks_resize((kstring_t *)&c,(long)&c->tid + (long)(int)cigar[4]);
                    p = (char *)((long)&c->tid + str.m);
                    c = (bam1_core_t *)((long)&c->tid + (long)(int)cigar[4]);
                    iVar2 = strcmp((char *)pbStack_40,"*");
                    if (iVar2 == 0) {
                      memset(p,0xff,(long)(int)cigar[4]);
                    }
                    else {
                      if ((q + (-1 - (long)pbStack_40) != (char *)(long)(int)cigar[4]) &&
                         (0 < hts_verbose)) {
                        fprintf(_stderr,"[E::%s] SEQ and QUAL are of different length\n",
                                "sam_parse1");
                        goto LAB_0011a0a6;
                      }
                      for (str.s._4_4_ = 0; (int)str.s._4_4_ < (int)cigar[4];
                          str.s._4_4_ = str.s._4_4_ + 1) {
                        p[(int)str.s._4_4_] = ((char *)pbStack_40)[(int)str.s._4_4_] + -0x21;
                      }
                    }
                    do {
                      while( true ) {
                        while( true ) {
                          while( true ) {
                            while( true ) {
                              while( true ) {
                                while( true ) {
                                  pcVar10 = q;
                                  if ((char *)((long)h_local->target_len + *(long *)h_local) <= q) {
                                    *(size_t *)(t + 0x28) = str.m;
                                    *(int *)(t + 0x20) = (int)c;
                                    *(int *)(t + 0x24) = (int)str.l;
                                    return 0;
                                  }
                                  pbStack_40 = (byte *)q;
                                  while( true ) {
                                    bVar12 = false;
                                    if (*q != '\0') {
                                      bVar12 = *q != '\t';
                                    }
                                    if (!bVar12) break;
                                    q = q + 1;
                                  }
                                  pcVar9 = q + 1;
                                  *q = '\0';
                                  q = pcVar9;
                                  if (((long)(pcVar9 + (-1 - (long)pcVar10)) < 6) &&
                                     (0 < hts_verbose)) {
                                    fprintf(_stderr,"[E::%s] incomplete aux field\n","sam_parse1");
                                    goto LAB_0011a0a6;
                                  }
                                  kputsn_(pcVar10,2,(kstring_t *)&c);
                                  x._3_1_ = ((char *)pbStack_40)[3];
                                  pbVar11 = (byte *)((char *)pbStack_40 + 5);
                                  if ((((x._3_1_ != 0x41) && (x._3_1_ != 0x61)) && (x._3_1_ != 99))
                                     && (x._3_1_ != 0x43)) break;
                                  pbStack_40 = pbVar11;
                                  kputc_(0x41,(kstring_t *)&c);
                                  kputc_((int)(char)*pbStack_40,(kstring_t *)&c);
                                }
                                if ((x._3_1_ != 0x69) && (x._3_1_ != 0x49)) break;
                                if (*pbVar11 == 0x2d) {
                                  pbStack_40 = pbVar11;
                                  _y_1 = strtol((char *)pbVar11,(char **)&stack0xffffffffffffffc0,10
                                               );
                                  if (_y_1 < -0x80) {
                                    if (_y_1 < -0x8000) {
                                      x_1._0_4_ = (undefined4)_y_1;
                                      kputc_(0x69,(kstring_t *)&c);
                                      kputsn_(&x_1,4,(kstring_t *)&c);
                                    }
                                    else {
                                      x_1._6_2_ = (undefined2)_y_1;
                                      kputc_(0x73,(kstring_t *)&c);
                                      kputsn_((void *)((long)&x_1 + 6),2,(kstring_t *)&c);
                                    }
                                  }
                                  else {
                                    kputc_(99,(kstring_t *)&c);
                                    kputc_((int)_y_1,(kstring_t *)&c);
                                  }
                                }
                                else {
                                  pbStack_40 = pbVar11;
                                  _y_3 = strtoul((char *)pbVar11,(char **)&stack0xffffffffffffffc0,
                                                 10);
                                  if (_y_3 < 0x100) {
                                    kputc_(0x43,(kstring_t *)&c);
                                    kputc_((int)_y_3,(kstring_t *)&c);
                                  }
                                  else if (_y_3 < 0x10000) {
                                    x_2._2_2_ = (undefined2)_y_3;
                                    kputc_(0x53,(kstring_t *)&c);
                                    kputsn_((void *)((long)&x_2 + 2),2,(kstring_t *)&c);
                                  }
                                  else {
                                    local_a0 = (undefined4)_y_3;
                                    kputc_(0x49,(kstring_t *)&c);
                                    kputsn_(&local_a0,4,(kstring_t *)&c);
                                  }
                                }
                              }
                              if (x._3_1_ != 0x66) break;
                              pbStack_40 = pbVar11;
                              dVar13 = strtod((char *)pbVar11,(char **)&stack0xffffffffffffffc0);
                              x_3._4_4_ = (float)dVar13;
                              kputc_(0x66,(kstring_t *)&c);
                              kputsn_((void *)((long)&x_3 + 4),4,(kstring_t *)&c);
                            }
                            if (x._3_1_ != 100) break;
                            pbStack_40 = pbVar11;
                            dStack_b0 = strtod((char *)pbVar11,(char **)&stack0xffffffffffffffc0);
                            kputc_(100,(kstring_t *)&c);
                            kputsn_(&stack0xffffffffffffff50,8,(kstring_t *)&c);
                          }
                          if ((x._3_1_ != 0x5a) && (x._3_1_ != 0x48)) break;
                          pbStack_40 = pbVar11;
                          kputc_((uint)x._3_1_,(kstring_t *)&c);
                          kputsn_(pbStack_40,(int)q - (int)pbStack_40,(kstring_t *)&c);
                        }
                        if (x._3_1_ != 0x42) break;
                        if (((long)(q + (-1 - (long)pbVar11)) < 3) && (0 < hts_verbose)) {
                          pbStack_40 = pbVar11;
                          fprintf(_stderr,"[E::%s] incomplete B-typed aux field\n","sam_parse1");
                          goto LAB_0011a0a6;
                        }
                        x._3_1_ = *pbVar11;
                        r._4_4_ = 0;
                        pbStack_40 = (byte *)((char *)pbStack_40 + 6);
                        for (pcStack_c0 = (char *)pbStack_40; *pcStack_c0 != '\0';
                            pcStack_c0 = pcStack_c0 + 1) {
                          if (*pcStack_c0 == ',') {
                            r._4_4_ = r._4_4_ + 1;
                          }
                        }
                        kputc_(0x42,(kstring_t *)&c);
                        kputc_((uint)x._3_1_,(kstring_t *)&c);
                        kputsn_((void *)((long)&r + 4),4,(kstring_t *)&c);
                        if (x._3_1_ == 99) {
                          while ((char *)pbStack_40 + 1 < q) {
                            lVar7 = strtol((char *)pbStack_40 + 1,(char **)&stack0xffffffffffffffc0,
                                           0);
                            x_8._3_1_ = (char)lVar7;
                            kputc_((int)x_8._3_1_,(kstring_t *)&c);
                          }
                        }
                        else if (x._3_1_ == 0x43) {
                          while ((char *)pbStack_40 + 1 < q) {
                            uVar6 = strtoul((char *)pbStack_40 + 1,(char **)&stack0xffffffffffffffc0
                                            ,0);
                            x_8._2_1_ = (byte)uVar6;
                            kputc_((uint)x_8._2_1_,(kstring_t *)&c);
                          }
                        }
                        else if (x._3_1_ == 0x73) {
                          while ((char *)pbStack_40 + 1 < q) {
                            lVar7 = strtol((char *)pbStack_40 + 1,(char **)&stack0xffffffffffffffc0,
                                           0);
                            x_8._0_2_ = (undefined2)lVar7;
                            kputsn_(&x_8,2,(kstring_t *)&c);
                          }
                        }
                        else if (x._3_1_ == 0x53) {
                          while ((char *)pbStack_40 + 1 < q) {
                            uVar6 = strtoul((char *)pbStack_40 + 1,(char **)&stack0xffffffffffffffc0
                                            ,0);
                            x_9._2_2_ = (undefined2)uVar6;
                            kputsn_((void *)((long)&x_9 + 2),2,(kstring_t *)&c);
                          }
                        }
                        else if (x._3_1_ == 0x69) {
                          while ((char *)pbStack_40 + 1 < q) {
                            lVar7 = strtol((char *)pbStack_40 + 1,(char **)&stack0xffffffffffffffc0,
                                           0);
                            x_10 = (float)lVar7;
                            kputsn_(&x_10,4,(kstring_t *)&c);
                          }
                        }
                        else if (x._3_1_ == 0x49) {
                          while ((char *)pbStack_40 + 1 < q) {
                            uVar6 = strtoul((char *)pbStack_40 + 1,(char **)&stack0xffffffffffffffc0
                                            ,0);
                            local_d0 = (undefined4)uVar6;
                            kputsn_(&local_d0,4,(kstring_t *)&c);
                          }
                        }
                        else if (x._3_1_ == 0x66) {
                          while ((char *)pbStack_40 + 1 < q) {
                            dVar13 = strtod((char *)pbStack_40 + 1,(char **)&stack0xffffffffffffffc0
                                           );
                            local_d4 = (float)dVar13;
                            kputsn_(&local_d4,4,(kstring_t *)&c);
                          }
                        }
                        else if (0 < hts_verbose) {
                          fprintf(_stderr,"[E::%s] unrecognized type\n","sam_parse1");
                          goto LAB_0011a0a6;
                        }
                      }
                    } while (hts_verbose < 1);
                    pbStack_40 = pbVar11;
                    fprintf(_stderr,"[E::%s] unrecognized type\n","sam_parse1");
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0011a0a6:
  *(size_t *)(t + 0x28) = str.m;
  *(int *)(t + 0x20) = (int)c;
  *(int *)(t + 0x24) = (int)str.l;
  return -2;
}

Assistant:

int sam_parse1(kstring_t *s, bam_hdr_t *h, bam1_t *b)
{
#define _read_token(_p) (_p); for (; *(_p) && *(_p) != '\t'; ++(_p)); if (*(_p) != '\t') goto err_ret; *(_p)++ = 0
#define _read_token_aux(_p) (_p); for (; *(_p) && *(_p) != '\t'; ++(_p)); *(_p)++ = 0 // this is different in that it does not test *(_p)=='\t'
#define _get_mem(type_t, _x, _s, _l) ks_resize((_s), (_s)->l + (_l)); *(_x) = (type_t*)((_s)->s + (_s)->l); (_s)->l += (_l)
#define _parse_err(cond, msg) do { if ((cond) && hts_verbose >= 1) { fprintf(stderr, "[E::%s] " msg "\n", __func__); goto err_ret; } } while (0)
#define _parse_warn(cond, msg) if ((cond) && hts_verbose >= 2) fprintf(stderr, "[W::%s] " msg "\n", __func__)

    uint8_t *t;
    char *p = s->s, *q;
    int i;
    kstring_t str;
    bam1_core_t *c = &b->core;

    str.l = b->l_data = 0;
    str.s = (char*)b->data; str.m = b->m_data;
    memset(c, 0, 32);
    if (h->cigar_tab == 0) {
        h->cigar_tab = (int8_t*) malloc(128);
        for (i = 0; i < 128; ++i)
            h->cigar_tab[i] = -1;
        for (i = 0; BAM_CIGAR_STR[i]; ++i)
            h->cigar_tab[(int)BAM_CIGAR_STR[i]] = i;
    }
    // qname
    q = _read_token(p);
    kputsn_(q, p - q, &str);
    c->l_qname = p - q;
    // flag
    c->flag = strtol(p, &p, 0);
    if (*p++ != '\t') goto err_ret; // malformated flag
    // chr
    q = _read_token(p);
    if (strcmp(q, "*")) {
        _parse_err(h->n_targets == 0, "missing SAM header");
        c->tid = bam_name2id(h, q);
        _parse_warn(c->tid < 0, "urecognized reference name; treated as unmapped");
    } else c->tid = -1;
    // pos
    c->pos = strtol(p, &p, 10) - 1;
    if (*p++ != '\t') goto err_ret;
    if (c->pos < 0 && c->tid >= 0) {
        _parse_warn(1, "mapped query cannot have zero coordinate; treated as unmapped");
        c->tid = -1;
    }
    if (c->tid < 0) c->flag |= BAM_FUNMAP;
    // mapq
    c->qual = strtol(p, &p, 10);
    if (*p++ != '\t') goto err_ret;
    // cigar
    if (*p != '*') {
        uint32_t *cigar;
        size_t n_cigar = 0;
        for (q = p; *p && *p != '\t'; ++p)
            if (!isdigit(*p)) ++n_cigar;
        if (*p++ != '\t') goto err_ret;
        _parse_err(n_cigar >= 65536, "too many CIGAR operations");
        c->n_cigar = n_cigar;
        _get_mem(uint32_t, &cigar, &str, c->n_cigar<<2);
        for (i = 0; i < c->n_cigar; ++i, ++q) {
            int op;
            cigar[i] = strtol(q, &q, 10)<<BAM_CIGAR_SHIFT;
            op = (uint8_t)*q >= 128? -1 : h->cigar_tab[(int)*q];
            _parse_err(op < 0, "unrecognized CIGAR operator");
            cigar[i] |= op;
        }
        i = bam_cigar2rlen(c->n_cigar, cigar);
    } else {
        _parse_warn(!(c->flag&BAM_FUNMAP), "mapped query must have a CIGAR; treated as unmapped");
        c->flag |= BAM_FUNMAP;
        q = _read_token(p);
        i = 1;
    }
    c->bin = hts_reg2bin(c->pos, c->pos + i, 14, 5);
    // mate chr
    q = _read_token(p);
    if (strcmp(q, "=") == 0) c->mtid = c->tid;
    else if (strcmp(q, "*") == 0) c->mtid = -1;
    else c->mtid = bam_name2id(h, q);
    // mpos
    c->mpos = strtol(p, &p, 10) - 1;
    if (*p++ != '\t') goto err_ret;
    if (c->mpos < 0 && c->mtid >= 0) {
        _parse_warn(1, "mapped mate cannot have zero coordinate; treated as unmapped");
        c->mtid = -1;
    }
    // tlen
    c->isize = strtol(p, &p, 10);
    if (*p++ != '\t') goto err_ret;
    // seq
    q = _read_token(p);
    if (strcmp(q, "*")) {
        c->l_qseq = p - q - 1;
        i = bam_cigar2qlen(c->n_cigar, (uint32_t*)(str.s + c->l_qname));
        _parse_err(c->n_cigar && i != c->l_qseq, "CIGAR and query sequence are of different length");
        i = (c->l_qseq + 1) >> 1;
        _get_mem(uint8_t, &t, &str, i);
        memset(t, 0, i);
        for (i = 0; i < c->l_qseq; ++i)
            t[i>>1] |= seq_nt16_table[(int)q[i]] << ((~i&1)<<2);
    } else c->l_qseq = 0;
    // qual
    q = _read_token_aux(p);
    _get_mem(uint8_t, &t, &str, c->l_qseq);
    if (strcmp(q, "*")) {
        _parse_err(p - q - 1 != c->l_qseq, "SEQ and QUAL are of different length");
        for (i = 0; i < c->l_qseq; ++i) t[i] = q[i] - 33;
    } else memset(t, 0xff, c->l_qseq);
    // aux
    // Note that (like the bam1_core_t fields) this aux data in b->data is
    // stored in host endianness; so there is no byte swapping needed here.
    while (p < s->s + s->l) {
        uint8_t type;
        q = _read_token_aux(p); // FIXME: can be accelerated for long 'B' arrays
        _parse_err(p - q - 1 < 6, "incomplete aux field");
        kputsn_(q, 2, &str);
        q += 3; type = *q++; ++q; // q points to value
        if (type == 'A' || type == 'a' || type == 'c' || type == 'C') {
            kputc_('A', &str);
            kputc_(*q, &str);
        } else if (type == 'i' || type == 'I') {
            if (*q == '-') {
                long x = strtol(q, &q, 10);
                if (x >= INT8_MIN) {
                    kputc_('c', &str); kputc_(x, &str);
                } else if (x >= INT16_MIN) {
                    int16_t y = x;
                    kputc_('s', &str); kputsn_((char*)&y, 2, &str);
                } else {
                    int32_t y = x;
                    kputc_('i', &str); kputsn_(&y, 4, &str);
                }
            } else {
                unsigned long x = strtoul(q, &q, 10);
                if (x <= UINT8_MAX) {
                    kputc_('C', &str); kputc_(x, &str);
                } else if (x <= UINT16_MAX) {
                    uint16_t y = x;
                    kputc_('S', &str); kputsn_(&y, 2, &str);
                } else {
                    uint32_t y = x;
                    kputc_('I', &str); kputsn_(&y, 4, &str);
                }
            }
        } else if (type == 'f') {
            float x;
            x = strtod(q, &q);
            kputc_('f', &str); kputsn_(&x, 4, &str);
        } else if (type == 'd') {
            double x;
            x = strtod(q, &q);
            kputc_('d', &str); kputsn_(&x, 8, &str);
        } else if (type == 'Z' || type == 'H') {
            kputc_(type, &str);kputsn_(q, p - q, &str); // note that this include the trailing NULL
        } else if (type == 'B') {
            int32_t n;
            char *r;
            _parse_err(p - q - 1 < 3, "incomplete B-typed aux field");
            type = *q++; // q points to the first ',' following the typing byte
            for (r = q, n = 0; *r; ++r)
                if (*r == ',') ++n;
            kputc_('B', &str); kputc_(type, &str); kputsn_(&n, 4, &str);
            // FIXME: to evaluate which is faster: a) aligned array and then memmove(); b) unaligned array; c) kputsn_()
            if (type == 'c')      while (q + 1 < p) { int8_t   x = strtol(q + 1, &q, 0); kputc_(x, &str); }
            else if (type == 'C') while (q + 1 < p) { uint8_t  x = strtoul(q + 1, &q, 0); kputc_(x, &str); }
            else if (type == 's') while (q + 1 < p) { int16_t  x = strtol(q + 1, &q, 0); kputsn_(&x, 2, &str); }
            else if (type == 'S') while (q + 1 < p) { uint16_t x = strtoul(q + 1, &q, 0); kputsn_(&x, 2, &str); }
            else if (type == 'i') while (q + 1 < p) { int32_t  x = strtol(q + 1, &q, 0); kputsn_(&x, 4, &str); }
            else if (type == 'I') while (q + 1 < p) { uint32_t x = strtoul(q + 1, &q, 0); kputsn_(&x, 4, &str); }
            else if (type == 'f') while (q + 1 < p) { float    x = strtod(q + 1, &q);    kputsn_(&x, 4, &str); }
            else _parse_err(1, "unrecognized type");
        } else _parse_err(1, "unrecognized type");
    }
    b->data = (uint8_t*)str.s; b->l_data = str.l; b->m_data = str.m;
    return 0;

#undef _parse_warn
#undef _parse_err
#undef _get_mem
#undef _read_token_aux
#undef _read_token
err_ret:
    b->data = (uint8_t*)str.s; b->l_data = str.l; b->m_data = str.m;
    return -2;
}